

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::Accumulate(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t *outY,
                    uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint32_t *puVar9;
  
  auVar5 = _DAT_0017f210;
  puVar8 = imageY + totalSimdWidth;
  puVar9 = outY + totalSimdWidth;
  for (; imageY != imageYEnd; imageY = imageY + rowSize) {
    for (lVar6 = 0; (ulong)simdWidth << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      auVar1 = *(undefined1 (*) [16])(imageY + lVar6);
      auVar2 = vpmovzxbd_avx(auVar1);
      auVar2 = vpaddd_avx(auVar2,*(undefined1 (*) [16])(outY + lVar6));
      auVar4 = vpunpckhbw_avx(auVar1,(undefined1  [16])0x0);
      auVar1 = vpshufb_avx(auVar1,auVar5);
      auVar3 = vpmovzxwd_avx(auVar4);
      auVar4 = vpunpckhwd_avx(auVar4,(undefined1  [16])0x0);
      *(undefined1 (*) [16])(outY + lVar6) = auVar2;
      auVar1 = vpaddd_avx(auVar1,*(undefined1 (*) [16])(outY + lVar6 + 4));
      *(undefined1 (*) [16])(outY + lVar6 + 4) = auVar1;
      auVar1 = vpaddd_avx(auVar3,*(undefined1 (*) [16])(outY + lVar6 + 8));
      *(undefined1 (*) [16])(outY + lVar6 + 8) = auVar1;
      auVar1 = vpaddd_avx(auVar4,*(undefined1 (*) [16])(outY + lVar6 + 0xc));
      *(undefined1 (*) [16])(outY + lVar6 + 0xc) = auVar1;
    }
    if (nonSimdWidth != 0) {
      for (uVar7 = 0; nonSimdWidth != uVar7; uVar7 = uVar7 + 1) {
        puVar9[uVar7] = puVar9[uVar7] + (uint)puVar8[uVar7];
      }
    }
    outY = outY + (nonSimdWidth + totalSimdWidth);
    puVar8 = puVar8 + rowSize;
    puVar9 = puVar9 + (nonSimdWidth + totalSimdWidth);
  }
  return;
}

Assistant:

void Accumulate( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t * outY, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        simd zero = _mm_setzero_si128();

        const uint32_t width = totalSimdWidth + nonSimdWidth;

        for( ; imageY != imageYEnd; imageY += rowSize, outY += width ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;
            simd       * dst    = reinterpret_cast <simd*> (outY);

            for( ; src != srcEnd; ++src ) {
                simd data = _mm_loadu_si128( src );

                const simd dataLo  = _mm_unpacklo_epi8( data, zero );
                const simd dataHi  = _mm_unpackhi_epi8( data, zero );

                const simd data_1 = _mm_unpacklo_epi16( dataLo, zero );
                const simd data_2 = _mm_unpackhi_epi16( dataLo, zero );
                const simd data_3 = _mm_unpacklo_epi16( dataHi, zero );
                const simd data_4 = _mm_unpackhi_epi16( dataHi, zero );

                _mm_storeu_si128( dst, _mm_add_epi32( data_1, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( data_2, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( data_3, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( data_4, _mm_loadu_si128( dst ) ) );
                ++dst;
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;
                uint32_t      * outX      = outY + totalSimdWidth;

                for( ; imageX != imageXEnd; ++imageX, ++outX )
                    (*outX) += (*imageX);
            }   
        }
    }